

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  PrimRef *pPVar2;
  RawBufferView *pRVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  PrimRef *pPVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  ulong uVar10;
  size_t sVar11;
  undefined4 uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t *psVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  size_t local_50;
  size_t local_48;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar14 = r->_begin;
  local_48 = 0;
  aVar16 = _DAT_01f45a40;
  aVar17 = _DAT_01f45a30;
  aVar18 = _DAT_01f45a40;
  aVar19 = _DAT_01f45a30;
  local_50 = k;
LAB_00259047:
  if (r->_end <= uVar14) {
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar19;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar18;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar17;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar16;
    __return_storage_ptr__->end = local_48;
    return __return_storage_ptr__;
  }
  uVar13 = uVar14 & 0xffffffff;
  pBVar4 = (this->super_Points).vertices.items;
  if (uVar13 < (pBVar4->super_RawBufferView).num) {
    psVar15 = &pBVar4[itime].super_RawBufferView.stride;
    uVar10 = itime - 1;
    do {
      uVar10 = uVar10 + 1;
      if (itime < uVar10) {
        psVar15 = &pBVar4[itime + 1].super_RawBufferView.stride;
        sVar11 = itime;
        goto LAB_002590bf;
      }
      sVar11 = *psVar15;
      pfVar1 = (float *)(((RawBufferView *)(psVar15 + -2))->ptr_ofs + sVar11 * uVar13);
      fVar28 = pfVar1[3];
      auVar20._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
      auVar20._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
      auVar20._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
      auVar20._12_4_ = -(uint)(fVar28 <= -1.844e+18);
      auVar23._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
      auVar23._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
      auVar23._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
      auVar23._12_4_ = -(uint)(1.844e+18 <= fVar28);
      if (fVar28 < 0.0) break;
      psVar15 = psVar15 + 7;
      uVar12 = movmskps((int)(sVar11 * uVar13),auVar20 | auVar23);
    } while ((char)uVar12 == '\0');
  }
  goto LAB_002590ae;
  while( true ) {
    pRVar3 = (RawBufferView *)(psVar15 + -2);
    pfVar1 = (float *)(pRVar3->ptr_ofs + *psVar15 * uVar13);
    fVar28 = pfVar1[3];
    auVar21._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
    auVar21._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
    auVar21._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
    auVar21._12_4_ = -(uint)(fVar28 <= -1.844e+18);
    auVar24._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
    auVar24._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
    auVar24._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
    auVar24._12_4_ = -(uint)(1.844e+18 <= fVar28);
    if (fVar28 < 0.0) break;
    psVar15 = psVar15 + 7;
    uVar12 = movmskps((int)pRVar3->ptr_ofs,auVar21 | auVar24);
    if ((char)uVar12 != '\0') break;
LAB_002590bf:
    sVar11 = sVar11 + 1;
    if (itime + 1 < sVar11) {
      pfVar1 = (float *)(pBVar4[itime].super_RawBufferView.ptr_ofs +
                        pBVar4[itime].super_RawBufferView.stride * uVar14);
      fVar9 = pfVar1[3];
      fVar28 = (this->super_Points).maxRadiusScale;
      fVar25 = *pfVar1 - fVar28 * fVar9;
      fVar26 = pfVar1[1] - fVar28 * fVar9;
      fVar27 = pfVar1[2] - fVar28 * fVar9;
      aVar22._0_4_ = fVar28 * fVar9 + *pfVar1;
      aVar22._4_4_ = fVar28 * fVar9 + pfVar1[1];
      aVar22._8_4_ = fVar28 * fVar9 + pfVar1[2];
      aVar22.m128[3] = (float)uVar14;
      auVar6._4_4_ = fVar26;
      auVar6._0_4_ = fVar25;
      auVar6._8_4_ = fVar27;
      auVar6._12_4_ = geomID;
      aVar19.m128 = (__m128)minps(aVar19.m128,auVar6);
      aVar18.m128 = (__m128)maxps(aVar18.m128,aVar22.m128);
      pPVar5 = prims->items;
      pPVar2 = pPVar5 + local_50;
      (pPVar2->lower).field_0.m128[0] = fVar25;
      (pPVar2->lower).field_0.m128[1] = fVar26;
      (pPVar2->lower).field_0.m128[2] = fVar27;
      (pPVar2->lower).field_0.m128[3] = (float)geomID;
      fVar28 = (float)geomID + (float)uVar14;
      auVar7._4_4_ = fVar26 + aVar22._4_4_;
      auVar7._0_4_ = fVar25 + aVar22._0_4_;
      auVar7._8_4_ = fVar27 + aVar22._8_4_;
      auVar7._12_4_ = fVar28;
      aVar17.m128 = (__m128)minps(aVar17.m128,auVar7);
      auVar8._4_4_ = fVar26 + aVar22._4_4_;
      auVar8._0_4_ = fVar25 + aVar22._0_4_;
      auVar8._8_4_ = fVar27 + aVar22._8_4_;
      auVar8._12_4_ = fVar28;
      aVar16.m128 = (__m128)maxps(aVar16.m128,auVar8);
      local_48 = local_48 + 1;
      pPVar5[local_50].upper.field_0 = aVar22;
      local_50 = local_50 + 1;
      break;
    }
  }
LAB_002590ae:
  uVar14 = uVar14 + 1;
  goto LAB_00259047;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, itime, bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }